

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_merge_to_ctx(lyd_node **trg,lyd_node *src,int options,ly_ctx *ctx)

{
  LYS_NODE LVar1;
  ly_ctx *ctx_00;
  int iVar2;
  uint dflt;
  LY_ERR *pLVar3;
  lys_node *plVar4;
  lyd_node *plVar5;
  lys_node *plVar6;
  lyd_node *plVar7;
  lyd_node *plVar8;
  lyd_node *plVar9;
  char *pcVar10;
  lyd_node *plVar11;
  lyd_node *sibling;
  char *format;
  int iVar12;
  lyd_node **pplVar13;
  int iVar14;
  int iVar15;
  bool bVar16;
  bool bVar17;
  lyd_node *local_88;
  lys_node *local_80;
  lyd_node *local_68;
  ly_ctx *local_50;
  lyd_node *local_40;
  
  pLVar3 = ly_errno_location();
  *pLVar3 = LY_SUCCESS;
  if ((trg == (lyd_node **)0x0) ||
     (sibling = *trg, src == (lyd_node *)0x0 || sibling == (lyd_node *)0x0)) {
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EINVAL;
    return -1;
  }
  plVar4 = sibling->schema;
  while (plVar4 = lys_parent(plVar4), plVar4 != (lys_node *)0x0) {
    if (plVar4->nodetype != LYS_USES) {
      pLVar3 = ly_errno_location();
      *pLVar3 = LY_EINVAL;
      ly_log(LY_LLERR,"Target not a top-level data tree.");
      return -1;
    }
  }
  local_50 = sibling->schema->module->ctx;
  if ((ctx == (ly_ctx *)0x0) || (plVar7 = sibling, local_50 == ctx)) {
    plVar4 = src->schema;
    if ((plVar4->module->ctx == local_50) && (bVar17 = local_50 == ctx, local_50 = ctx, bVar17)) {
      local_50 = (ly_ctx *)0x0;
    }
  }
  else {
    do {
      sibling = plVar7;
      plVar7 = sibling->prev;
    } while (sibling->prev->next != (lyd_node *)0x0);
    *trg = sibling;
    plVar7 = (lyd_node *)0x0;
    for (; sibling != (lyd_node *)0x0; sibling = sibling->next) {
      plVar5 = lyd_dup_to_ctx(sibling,1,ctx);
      if ((plVar5 == (lyd_node *)0x0) ||
         ((plVar7 != (lyd_node *)0x0 &&
          (iVar2 = lyd_insert_after(plVar7->prev,plVar5), plVar5 = plVar7, iVar2 != 0)))) {
        plVar7 = (lyd_node *)0x0;
        goto LAB_001584ed;
      }
      plVar7 = plVar5;
    }
    plVar4 = src->schema;
    sibling = plVar7;
    local_50 = ctx;
  }
  bVar17 = true;
  iVar2 = 0;
  while (plVar6 = lys_parent(plVar4), plVar6 != (lys_node *)0x0) {
    plVar4 = lys_parent(plVar4);
    iVar2 = iVar2 + -1;
  }
  dflt = 1;
  if (iVar2 != 0) {
    plVar7 = src;
    if (((uint)options >> 0xc & 1) == 0) {
      for (; plVar7 != (lyd_node *)0x0; plVar7 = plVar7->next) {
        if ((plVar7->field_0x9 & 1) == 0) {
          dflt = 0;
          goto LAB_00158150;
        }
      }
      dflt = 1;
    }
    else {
      dflt = (byte)src->field_0x9 & 1;
    }
  }
LAB_00158150:
  local_88 = (lyd_node *)0x0;
  local_80 = (lys_node *)0x0;
  iVar15 = 0;
  local_68 = sibling;
  plVar5 = (lyd_node *)0x0;
  do {
    plVar7 = plVar5;
    iVar12 = -iVar15 - iVar2;
    plVar4 = src->schema;
    do {
      plVar6 = plVar4;
      iVar14 = 0;
      if (0 < iVar12) {
        iVar14 = iVar12;
      }
      while (bVar16 = iVar14 != 0, iVar14 = iVar14 + -1, bVar16) {
        plVar6 = lys_parent(plVar6);
      }
      plVar4 = src->schema;
      if (plVar6 == plVar4) {
        if (((uint)options >> 10 & 1) != 0) {
          plVar5 = src->prev;
          plVar8 = src;
          if (((uint)options >> 0xc & 1) != 0 && plVar5 != src) {
            lyd_unlink(src);
            lyd_free_withsiblings(plVar5);
          }
          goto LAB_0015835e;
        }
        plVar5 = (lyd_node *)0x0;
        goto LAB_001582e1;
      }
      iVar15 = iVar15 + 1;
      iVar12 = iVar12 + -1;
    } while ((plVar6->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN);
    if (plVar6->nodetype != LYS_CONTAINER) {
      pLVar3 = ly_errno_location();
      *pLVar3 = LY_EINVAL;
      pcVar10 = strnodetype(plVar6->nodetype);
      format = "Cannot create %s \"%s\" for the merge.";
LAB_00158595:
      ly_log(LY_LLERR,format,pcVar10);
      break;
    }
    if (plVar7 == (lyd_node *)0x0) {
      local_88 = local_68;
      if (!bVar17) {
        pplVar13 = &local_68->child;
        goto LAB_00158237;
      }
      while (plVar5 = local_68, local_88 != (lyd_node *)0x0) {
        local_80 = plVar6;
        if ((local_50 != (ly_ctx *)0x0) &&
           (local_80 = lys_get_schema_inctx(plVar6,local_50), local_80 == (lys_node *)0x0)) {
          pLVar3 = ly_errno_location();
          *pLVar3 = LY_EINVAL;
          plVar7 = (lyd_node *)0x0;
          ly_log(LY_LLERR,
                 "Target context does not contain schema node for the data node being merged (%s:%s)."
                 ,plVar6->module->name,plVar6->name);
          goto LAB_001584ed;
        }
        plVar5 = local_88;
        if (local_88->schema == local_80) break;
        pplVar13 = &local_88->next;
LAB_00158237:
        local_88 = *pplVar13;
      }
      local_68 = plVar5;
      if (((uint)options >> 10 & 1) == 0) {
        plVar6 = local_80;
      }
      bVar17 = false;
    }
    else if ((((uint)options >> 10 & 1) == 0 && local_50 != (ly_ctx *)0x0) &&
            (plVar6 = lys_get_schema_inctx(plVar6,local_50), plVar6 == (lys_node *)0x0)) {
      pLVar3 = ly_errno_location();
      *pLVar3 = LY_EINVAL;
      pcVar10 = *(char **)(_DAT_00000030 + 8);
      format = "Target context does not contain schema node for the data node being merged (%s:%s)."
      ;
      goto LAB_00158595;
    }
    plVar5 = plVar7;
  } while (((local_88 != (lyd_node *)0x0) ||
           (plVar5 = _lyd_new((lyd_node *)0x0,plVar6,dflt), plVar7 == (lyd_node *)0x0)) ||
          (iVar12 = lyd_insert(plVar5,plVar7), iVar12 == 0));
  goto LAB_001584ed;
LAB_001582e1:
  plVar8 = plVar5;
  if (src == (lyd_node *)0x0) goto LAB_0015835e;
  plVar8 = lyd_dup_to_ctx(src,1,local_50);
  if ((plVar8 == (lyd_node *)0x0) ||
     ((plVar5 != (lyd_node *)0x0 &&
      (iVar2 = lyd_insert_after(plVar5->prev,plVar8), plVar8 = plVar5, iVar2 != 0)))) {
    lyd_free_withsiblings(plVar5);
    goto LAB_001584ed;
  }
  if (((uint)options >> 0xc & 1) != 0) goto LAB_0015835e;
  src = src->next;
  plVar5 = plVar8;
  goto LAB_001582e1;
code_r0x001583ca:
  plVar5 = plVar9->next;
  for (plVar11 = plVar8; plVar11 != (lyd_node *)0x0; plVar11 = plVar11->next) {
    iVar2 = lyd_merge_node_equal(plVar11,plVar9);
    if (iVar2 != 0) {
      LVar1 = plVar11->schema->nodetype;
      if (LVar1 == LYS_CONTAINER) {
LAB_0015847a:
        iVar2 = lyd_merge_parent_children(plVar11,plVar9->child,options);
        if (iVar2 == 0) goto LAB_001583c1;
      }
      else {
        if (LVar1 == LYS_LEAF) {
LAB_0015846a:
          lyd_merge_node_update(plVar11,plVar9);
          goto LAB_001583c1;
        }
        if (LVar1 == LYS_LEAFLIST) goto LAB_001583c1;
        if (LVar1 == LYS_LIST) goto LAB_0015847a;
        if (LVar1 == LYS_ANYDATA) goto LAB_0015846a;
        if ((((LVar1 == LYS_NOTIF) || (LVar1 == LYS_RPC)) || (LVar1 == LYS_INPUT)) ||
           (LVar1 == LYS_OUTPUT)) goto LAB_0015847a;
        if (LVar1 == LYS_ANYXML) goto LAB_0015846a;
        pLVar3 = ly_errno_location();
        *pLVar3 = LY_EINT;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
               ,0x83b);
      }
      iVar2 = 1;
      goto LAB_0015853e;
    }
    pLVar3 = ly_errno_location();
    if (*pLVar3 != LY_SUCCESS) goto LAB_001584ed;
  }
  if (ctx_00 == plVar9->schema->module->ctx) {
    lyd_unlink(plVar9);
    if (plVar9 == local_40) {
      local_40 = plVar5;
    }
  }
  else {
    plVar9 = lyd_dup_to_ctx(plVar9,1,ctx_00);
  }
  lyd_insert_after(plVar8->prev,plVar9);
  goto LAB_001583c1;
LAB_0015835e:
  plVar5 = plVar7;
  plVar9 = plVar8;
  if (plVar7 != (lyd_node *)0x0) {
    do {
      plVar11 = plVar5;
      plVar5 = plVar11->child;
    } while (plVar11->child != (lyd_node *)0x0);
    plVar11->child = plVar8;
    for (; plVar9 = plVar7, plVar8 != (lyd_node *)0x0; plVar8 = plVar8->next) {
      plVar8->parent = plVar11;
    }
  }
  plVar7 = plVar9;
  if (bVar17) {
    ctx_00 = local_68->schema->module->ctx;
    do {
      plVar8 = local_68;
      local_68 = plVar8->prev;
      plVar5 = plVar7;
      local_40 = plVar7;
    } while (plVar8->prev->next != (lyd_node *)0x0);
LAB_001583c1:
    plVar9 = plVar5;
    if (plVar9 != (lyd_node *)0x0) goto code_r0x001583ca;
    iVar2 = 0;
LAB_0015853e:
    lyd_free_withsiblings(local_40);
    goto LAB_001584d5;
  }
  iVar2 = lyd_merge_parent_children(local_68,plVar7,options);
LAB_001584d5:
  if (iVar2 == 0) {
    if (sibling->schema->nodetype == LYS_RPC) {
      lyd_schema_sort(sibling,1);
    }
    if (*trg != sibling) {
      lyd_free_withsiblings(*trg);
      *trg = sibling;
      return 0;
    }
    return 0;
  }
LAB_001584ed:
  if (*trg != sibling) {
    lyd_free_withsiblings(sibling);
  }
  lyd_free_withsiblings(plVar7);
  return -1;
}

Assistant:

API int
lyd_merge_to_ctx(struct lyd_node **trg, const struct lyd_node *src, int options, struct ly_ctx *ctx)
{
    struct lyd_node *node = NULL, *node2, *target, *trg_merge_start, *src_merge_start = NULL;
    const struct lyd_node *iter;
    struct lys_node *src_snode, *sch = NULL;
    int i, src_depth, depth, first_iter, ret, dflt = 1;
    const struct lys_node *parent = NULL;

    /* initialize errno */
    ly_errno = LY_SUCCESS;

    if (!trg || !(*trg) || !src) {
        ly_errno = LY_EINVAL;
        return -1;
    }
    target = *trg;

    parent = lys_parent(target->schema);

    /* go up all uses */
    while (parent && (parent->nodetype == LYS_USES)) {
        parent = lys_parent(parent);
    }

    if (parent) {
        LOGERR(LY_EINVAL, "Target not a top-level data tree.");
        return -1;
    }

    /* get know if we are converting data into a different context */
    if (ctx && target->schema->module->ctx != ctx) {
        /* target's data tree context differs from the target context, move the target
         * data tree into the target context */

        /* get the first target's top-level and store it as the result */
        for (; target->prev->next; target = target->prev);
        *trg = target;

        for (node = NULL, trg_merge_start = target; target; target = target->next) {
            node2 = lyd_dup_to_ctx(target, 1, ctx);
            if (!node2) {
                goto error;
            }
            if (node) {
                if (lyd_insert_after(node->prev, node2)) {
                    goto error;
                }
            } else {
                node = node2;
            }
        }
        target = node;
        node = NULL;
    } else if (src->schema->module->ctx != target->schema->module->ctx) {
        /* the source data will be converted into the target's context during the merge */
        ctx = target->schema->module->ctx;
    } else if (ctx == src->schema->module->ctx) {
        /* no conversion is needed */
        ctx = NULL;
    }

    /* find source top-level schema node */
    for (src_snode = src->schema, src_depth = 0;
         lys_parent(src_snode);
         src_snode = lys_parent(src_snode), ++src_depth);

    /* find first shared missing schema parent of the subtrees */
    trg_merge_start = target;
    depth = 0;
    first_iter = 1;
    if (src_depth) {
        /* we are going to create missing parents in the following loop,
         * but we will need to know a dflt flag for them. In case the newly
         * created parent is going to have at least one non-default child,
         * it will be also non-default, otherwise it will be the default node */
        if (options & LYD_OPT_NOSIBLINGS) {
            dflt = src->dflt;
        } else {
            LY_TREE_FOR(src, iter) {
                if (!iter->dflt) {
                    /* non default sibling -> parent is going to be
                     * created also as non-default */
                    dflt = 0;
                    break;
                }
            }
        }
    }
    while (1) {
        /* going from down (source root) to up (top-level or the common node with target */
        do {
            for (src_snode = src->schema, i = 0; i < src_depth - depth; src_snode = lys_parent(src_snode), ++i);
            ++depth;
        } while (src_snode != src->schema && (src_snode->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES)));

        if (src_snode == src->schema) {
            break;
        }

        if (src_snode->nodetype != LYS_CONTAINER) {
            /* we would have to create a list (the only data node with children except container), impossible */
            LOGERR(LY_EINVAL, "Cannot create %s \"%s\" for the merge.", strnodetype(src_snode->nodetype), src_snode->name);
            goto error;
        }

        /* have we created any missing containers already? if we did,
         * it is totally useless to search for match, there won't ever be */
        if (!src_merge_start) {
            if (first_iter) {
                node = trg_merge_start;
                first_iter = 0;
            } else {
                node = trg_merge_start->child;
            }

            /* find it in target data nodes */
            LY_TREE_FOR(node, node) {
                if (ctx) {
                    /* we have the schema nodes in the different context */
                    sch = lys_get_schema_inctx(src_snode, ctx);
                    if (!sch) {
                        LOGERR(LY_EINVAL, "Target context does not contain schema node for the data node being "
                               "merged (%s:%s).", src_snode->module->name, src_snode->name);
                        goto error;
                    }
                } else {
                    /* the context is same and comparison of the schema nodes will works fine */
                    sch = src_snode;
                }

                if (node->schema == sch) {
                    trg_merge_start = node;
                    break;
                }
            }

            if (!(options & LYD_OPT_DESTRUCT)) {
                /* the source tree will be duplicated, so to save some work in case
                 * of different target context, create also the parents nodes in the
                 * correct context */
                src_snode = sch;
            }
        } else if (ctx && !(options & LYD_OPT_DESTRUCT)) {
            /* get the schema node in the correct (target) context, same as above,
             * this is done to save some work and have the source in the same context
             * when the provided source tree is below duplicated in the target context
             * and connected into the parents created here */
            src_snode = lys_get_schema_inctx(src_snode, ctx);
            if (!src_snode) {
                LOGERR(LY_EINVAL, "Target context does not contain schema node for the data node being "
                       "merged (%s:%s).", src_snode->module->name, src_snode->name);
                goto error;
            }
        }

        if (!node) {
            /* it is not there, create it */
            node2 = _lyd_new(NULL, src_snode, dflt);
            if (!src_merge_start) {
                src_merge_start = node2;
            } else {
                if (lyd_insert(node2, src_merge_start)) {
                    goto error;
                }
                src_merge_start = node2;
            }
        }
    }

    /* process source according to options */
    if (options & LYD_OPT_DESTRUCT) {
        node = (struct lyd_node *)src;
        if ((node->prev != node) && (options & LYD_OPT_NOSIBLINGS)) {
            node2 = node->prev;
            lyd_unlink(node);
            lyd_free_withsiblings(node2);
        }
    } else {
        node = NULL;
        for (; src; src = src->next) {
            /* because we already have to duplicate it, do it in the correct context */
            node2 = lyd_dup_to_ctx(src, 1, ctx);
            if (!node2) {
                lyd_free_withsiblings(node);
                goto error;
            }
            if (node) {
                if (lyd_insert_after(node->prev, node2)) {
                    lyd_free_withsiblings(node);
                    goto error;
                }
            } else {
                node = node2;
            }

            if (options & LYD_OPT_NOSIBLINGS) {
                break;
            }
        }
    }

    if (src_merge_start) {
        /* insert data into the created parents */
        /* first, get the lowest created parent, we don't have to check the nodetype since we are
         * creating only a simple chain of containers */
        for (node2 = src_merge_start; node2->child; node2 = node2->child);
        node2->child = node;
        LY_TREE_FOR(node, node) {
            node->parent = node2;
        }
    } else {
        src_merge_start = node;
    }

    if (!first_iter) {
        /* !! src_merge start is a child(ren) of trg_merge_start */
        ret = lyd_merge_parent_children(trg_merge_start, src_merge_start, options);
    } else {
        /* !! src_merge start is a (top-level) sibling(s) of trg_merge_start */
        ret = lyd_merge_siblings(trg_merge_start, src_merge_start, options);
    }
    if (ret) {
        goto error;
    }

    if (target->schema->nodetype == LYS_RPC) {
        lyd_schema_sort(target, 1);
    }

    /* update the pointer to the target tree if needed */
    if (*trg != target) {
        lyd_free_withsiblings(*trg);
        (*trg) = target;
    }
    return ret;

error:
    if (*trg != target) {
        /* target is duplication of the original target in different context,
         * free it due to the error */
        lyd_free_withsiblings(target);
    }
    lyd_free_withsiblings(src_merge_start);
    return -1;
}